

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O1

void __thiscall glslang::TSmallArrayVector::pop_front(TSmallArrayVector *this)

{
  pointer __src;
  pointer *ppTVar1;
  TVector<glslang::TArraySize> *pTVar2;
  pointer __dest;
  pointer pTVar3;
  long lVar4;
  
  pTVar2 = this->sizes;
  if (pTVar2 != (TVector<glslang::TArraySize> *)0x0) {
    __dest = (pTVar2->
             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (pTVar2->
             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    lVar4 = (long)pTVar3 - (long)__dest >> 4;
    if (lVar4 == 1) {
      this->sizes = (TVector<glslang::TArraySize> *)0x0;
    }
    else {
      if (lVar4 == 0) goto LAB_003cbb7a;
      __src = __dest + 1;
      if (__src != pTVar3) {
        memmove(__dest,__src,(long)pTVar3 - (long)__src);
      }
      ppTVar1 = &(pTVar2->
                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + -1;
    }
    return;
  }
LAB_003cbb7a:
  __assert_fail("sizes != nullptr && sizes->size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0x8f,"void glslang::TSmallArrayVector::pop_front()");
}

Assistant:

void pop_front()
    {
        assert(sizes != nullptr && sizes->size() > 0);
        if (sizes->size() == 1)
            dealloc();
        else
            sizes->erase(sizes->begin());
    }